

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

int __thiscall KDIS::NETWORK::Connection::shutdown(Connection *this,int __fd,int __how)

{
  int in_EAX;
  KException *this_00;
  int *piVar1;
  KCHAR8 *__s;
  Connection *this_01;
  long lVar2;
  allocator<char> local_39;
  KString local_38;
  
  lVar2 = 0;
  do {
    if (lVar2 == 2) {
      return in_EAX;
    }
    if (this->m_iSocket[lVar2] != 0) {
      in_EAX = close(this->m_iSocket[lVar2]);
      if (in_EAX == -1) {
        this_01 = (Connection *)0x30;
        this_00 = (KException *)__cxa_allocate_exception();
        piVar1 = __errno_location();
        __s = getErrorText(this_01,*piVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
        KException::KException(this_00,&local_38,0xc);
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
      this->m_iSocket[lVar2] = 0;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void Connection::shutdown() noexcept(false)
{
    for( KINT8 i = 0; i < 2; ++i )
    {
        if( m_iSocket[i] )
        {
            #if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )
                KINT32 iError = closesocket( m_iSocket[i] );
            #else
                KINT32 iError = close( m_iSocket[i] );
            #endif

            if( iError == SOCKET_ERROR )
            {
                THROW_ERROR;
            }

            m_iSocket[i] = 0;
        }
    }
}